

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col)

{
  uint uVar1;
  ImTextureID local_38;
  
  if (col < 0x1000000) {
    return;
  }
  uVar1 = (this->_TextureIdStack).Size;
  local_38 = user_texture_id;
  if ((ulong)uVar1 != 0) {
    if ((int)uVar1 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                    ,0x395,"value_type &ImVector<void *>::back() [T = void *]");
    }
    if ((this->_TextureIdStack).Data[(ulong)uVar1 - 1] == user_texture_id) {
      PrimReserve(this,6,4);
      PrimRectUV(this,a,b,uv_a,uv_b,col);
      return;
    }
  }
  PushTextureID(this,&local_38);
  PrimReserve(this,6,4);
  PrimRectUV(this,a,b,uv_a,uv_b,col);
  PopTextureID(this);
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    // FIXME-OPT: This is wasting draw calls.
    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(a, b, uv_a, uv_b, col);

    if (push_texture_id)
        PopTextureID();
}